

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O0

bool __thiscall
msgpack11::NumberValue<(msgpack11::MsgPack::Type)2,_double>::equals
          (NumberValue<(msgpack11::MsgPack::Type)2,_double> *this,MsgPackValue *other)

{
  int iVar1;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  MsgPackValue *other_local;
  NumberValue<(msgpack11::MsgPack::Type)2,_double> *this_local;
  
  iVar1 = (*other->_vptr_MsgPackValue[3])();
  if (iVar1 - 1U < 10) {
    (*(this->super_Value<(msgpack11::MsgPack::Type)2,_double>).super_MsgPackValue._vptr_MsgPackValue
      [6])();
    (*other->_vptr_MsgPackValue[6])();
    this_local._7_1_ = extraout_XMM0_Qa == extraout_XMM0_Qa_00;
  }
  else {
    this_local._7_1_ =
         Value<(msgpack11::MsgPack::Type)2,_double>::equals
                   (&this->super_Value<(msgpack11::MsgPack::Type)2,_double>,other);
  }
  return this_local._7_1_;
}

Assistant:

bool equals(const MsgPackValue * other) const override {
        switch( other->type() )
        {
            case MsgPack::FLOAT32 : // fall through
            case MsgPack::FLOAT64 : // fall through
            case MsgPack::UINT8   : // fall through
            case MsgPack::UINT16  : // fall through
            case MsgPack::UINT32  : // fall through
            case MsgPack::UINT64  : // fall through
            case MsgPack::INT8    : // fall through
            case MsgPack::INT16   : // fall through
            case MsgPack::INT32   : // fall through
            case MsgPack::INT64   : // fall through
            {
                return float64_value() == other->float64_value();
            } break;
            default               :
            {
                return Value<tag,T>::equals( other );
            } break;
        }
    }